

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.capnp.h
# Opt level: O0

Builder * __thiscall
capnp::compiler::Declaration::Id::Builder::initUid(Builder *__return_storage_ptr__,Builder *this)

{
  uint uVar1;
  PointerBuilder local_28;
  Builder *local_10;
  Builder *this_local;
  
  local_10 = this;
  uVar1 = bounded<0u>();
  capnp::_::StructBuilder::setDataField<capnp::compiler::Declaration::Id::Which>
            (&this->_builder,uVar1,UID);
  uVar1 = bounded<1u>();
  capnp::_::StructBuilder::getPointerField(&local_28,&this->_builder,uVar1);
  capnp::_::PointerHelpers<capnp::compiler::LocatedInteger,_(capnp::Kind)3>::init
            ((EVP_PKEY_CTX *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline  ::capnp::compiler::LocatedInteger::Builder Declaration::Id::Builder::initUid() {
  _builder.setDataField<Declaration::Id::Which>(
      ::capnp::bounded<0>() * ::capnp::ELEMENTS, Declaration::Id::UID);
  return ::capnp::_::PointerHelpers< ::capnp::compiler::LocatedInteger>::init(_builder.getPointerField(
      ::capnp::bounded<1>() * ::capnp::POINTERS));
}